

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::create_binary_variable
          (Proof *this,int vertex,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *name)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  int local_38;
  int local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_38 = vertex;
  local_34 = vertex;
  if ((name->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*name->_M_invoker)(&local_30,(_Any_data *)name,&local_34);
    std::
    _Rb_tree<long,std::pair<long_const,std::__cxx11::string>,std::_Select1st<std::pair<long_const,std::__cxx11::string>>,std::less<long>,std::allocator<std::pair<long_const,std::__cxx11::string>>>
    ::_M_emplace_unique<int&,std::__cxx11::string>
              ((_Rb_tree<long,std::pair<long_const,std::__cxx11::string>,std::_Select1st<std::pair<long_const,std::__cxx11::string>>,std::less<long>,std::allocator<std::pair<long_const,std::__cxx11::string>>>
                *)&(_Var1._M_head_impl)->binary_variable_mappings,&local_38,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

auto Proof::create_binary_variable(int vertex,
    const function<auto(int)->string> & name) -> void
{
    _imp->binary_variable_mappings.emplace(vertex, name(vertex));
}